

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prof.c
# Opt level: O0

void __thiscall CProficiencies::UpdateProfPoints(CProficiencies *this)

{
  CHAR_DATA *in_RDI;
  string buffer;
  undefined1 in_stack_00000120 [16];
  undefined1 in_stack_00000130 [16];
  char *in_stack_fffffffffffffed0;
  CHAR_DATA *in_stack_fffffffffffffed8;
  char *local_120;
  char *local_118;
  char **local_110;
  size_t local_108;
  string local_100 [40];
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char_*,_char_*> local_d8;
  undefined8 local_b8;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char_*,_char_*> *local_b0
  ;
  char **local_a8;
  size_t local_a0;
  char **local_98;
  v9 *local_90;
  char **local_88;
  size_t sStack_80;
  string *local_78;
  char *local_70;
  char ***local_68;
  char *local_60;
  char ***local_58;
  char ***local_50;
  char **local_48;
  size_t sStack_40;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char_*,_char_*> *local_38
  ;
  undefined8 *local_30;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char_*,_char_*> *local_28
  ;
  undefined8 local_20;
  undefined8 *local_18;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char_*,_char_*> *local_10
  ;
  char *local_8;
  
  if ((long)&in_RDI->next[4].long_descr <=
      (long)in_RDI->next_in_room->played + (current_time - in_RDI->next_in_room->logon)) {
    local_68 = &local_110;
    local_70 = "{}You feel ready to study new proficiencies.{}\n\r";
    local_60 = "{}You feel ready to study new proficiencies.{}\n\r";
    local_110 = (char **)0x83527f;
    local_58 = local_68;
    local_108 = std::char_traits<char>::length((char_type *)0x7ac0ee);
    local_8 = local_70;
    local_118 = get_char_color(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
    local_120 = END_COLOR(in_RDI);
    local_78 = local_100;
    local_88 = local_110;
    sStack_80 = local_108;
    local_90 = (v9 *)&local_118;
    local_98 = &local_120;
    local_50 = &local_88;
    local_a8 = local_110;
    local_a0 = local_108;
    local_48 = local_a8;
    sStack_40 = local_a0;
    ::fmt::v9::make_format_args<fmt::v9::basic_format_context<fmt::v9::appender,char>,char*&,char*&>
              (&local_d8,local_90,local_98,local_110);
    local_30 = &local_b8;
    local_38 = &local_d8;
    local_20 = 0xcc;
    local_b8 = 0xcc;
    local_28 = local_38;
    local_18 = local_30;
    local_10 = local_38;
    local_b0 = local_38;
    ::fmt::v9::vformat_abi_cxx11_((string_view)in_stack_00000130,(format_args)in_stack_00000120);
    if (in_RDI->next == (CHAR_DATA *)0x0) {
      send_to_char(in_stack_fffffffffffffed0,in_RDI);
    }
    *(int *)&in_RDI->master = *(int *)&in_RDI->master + 5;
    std::__cxx11::string::c_str();
    send_to_char(in_stack_fffffffffffffed0,in_RDI);
    in_RDI->next = (CHAR_DATA *)
                   ((long)in_RDI->next_in_room->played +
                   (current_time - in_RDI->next_in_room->logon));
    std::__cxx11::string::~string(local_100);
  }
  return;
}

Assistant:

void CProficiencies::UpdateProfPoints()
{
	if (ch->played + (current_time - ch->logon) < pawardedtime + 3600)
		return;

	auto buffer = fmt::format("{}You feel ready to study new proficiencies.{}\n\r", 
		get_char_color(ch,"yellow"), 
		END_COLOR(ch));

	if (pawardedtime == 0)
		send_to_char("See HELP PROFICIENCY for more information.\n\r", ch);

	points += POINTS_PER_HOUR;

	send_to_char(buffer.c_str(), ch);

	pawardedtime = ch->played + (current_time - ch->logon);
}